

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  char *pcVar5;
  int overflow;
  secp256k1_scalar sec;
  secp256k1_scalar factor;
  int local_74;
  secp256k1_scalar local_70;
  secp256k1_scalar local_50;
  
  local_74 = 0;
  if (ctx == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/secp256k1.c"
            ,0x2cd,"test condition failed: ctx != NULL");
    abort();
  }
  if (seckey == (uchar *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "seckey != NULL";
  }
  else {
    if (tweak32 != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_50,tweak32,&local_74);
      uVar2 = secp256k1_scalar_set_b32_seckey(&local_70,seckey);
      iVar1 = local_74;
      uVar3 = secp256k1_scalar_is_zero(&local_50);
      uVar3 = ~uVar3;
      if (iVar1 != 0) {
        uVar3 = 0;
      }
      secp256k1_scalar_mul(&local_70,&local_70,&local_50);
      secp256k1_scalar_cmov(&local_70,&secp256k1_scalar_zero,uVar3 & uVar2 ^ 1);
      secp256k1_scalar_get_b32(seckey,&local_70);
      secp256k1_scalar_clear(&local_70);
      secp256k1_scalar_clear(&local_50);
      return uVar3 & uVar2;
    }
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "tweak32 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar5,pvVar4);
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}